

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O1

void __thiscall Assimp::ASEImporter::BuildLights(ASEImporter *this)

{
  int iVar1;
  pointer pLVar2;
  pointer pLVar3;
  ulong __n;
  aiLight **ppaVar4;
  aiLight *paVar5;
  ulong uVar6;
  long lVar7;
  aiScene *paVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pLVar2 = (this->mParser->m_vLights).
           super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (this->mParser->m_vLights).
           super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar2 != pLVar3) {
    this->pcScene->mNumLights = (int)((ulong)((long)pLVar3 - (long)pLVar2) >> 4) * -0x1642c859;
    paVar8 = this->pcScene;
    ppaVar4 = (aiLight **)operator_new__((ulong)paVar8->mNumLights << 3);
    paVar8->mLights = ppaVar4;
    paVar8 = this->pcScene;
    if (paVar8->mNumLights != 0) {
      lVar7 = 0x16c;
      uVar6 = 0;
      do {
        paVar5 = (aiLight *)operator_new(0x46c);
        (paVar5->mName).length = 0;
        (paVar5->mName).data[0] = '\0';
        memset((paVar5->mName).data + 1,0x1b,0x3ff);
        paVar5->mType = aiLightSource_UNDEFINED;
        (paVar5->mPosition).x = 0.0;
        (paVar5->mPosition).y = 0.0;
        (paVar5->mPosition).z = 0.0;
        (paVar5->mDirection).x = 0.0;
        (paVar5->mDirection).y = 0.0;
        *(undefined8 *)&(paVar5->mDirection).z = 0;
        (paVar5->mUp).x = 0.0;
        (paVar5->mUp).y = 0.0;
        *(undefined8 *)&(paVar5->mUp).z = 0;
        paVar5->mAttenuationLinear = 1.0;
        paVar5->mAttenuationQuadratic = 0.0;
        (paVar5->mColorDiffuse).r = 0.0;
        (paVar5->mColorDiffuse).g = 0.0;
        (paVar5->mColorDiffuse).b = 0.0;
        (paVar5->mColorSpecular).r = 0.0;
        (paVar5->mColorSpecular).g = 0.0;
        *(undefined8 *)&(paVar5->mColorSpecular).b = 0;
        (paVar5->mColorAmbient).g = 0.0;
        (paVar5->mColorAmbient).b = 0.0;
        paVar5->mAngleInnerCone = 6.2831855;
        paVar5->mAngleOuterCone = 6.2831855;
        (paVar5->mSize).x = 0.0;
        (paVar5->mSize).y = 0.0;
        paVar8->mLights[uVar6] = paVar5;
        pLVar2 = (this->mParser->m_vLights).
                 super__Vector_base<Assimp::ASE::Light,_std::allocator<Assimp::ASE::Light>_>._M_impl
                 .super__Vector_impl_data._M_start;
        (paVar5->mDirection).x = 0.0;
        (paVar5->mDirection).y = 0.0;
        (paVar5->mDirection).z = -1.0;
        __n = *(ulong *)((long)pLVar2 + lVar7 + -0x15c);
        if (__n < 0x400) {
          (paVar5->mName).length = (ai_uint32)__n;
          memcpy((paVar5->mName).data,*(void **)((long)pLVar2 + lVar7 + -0x164),__n);
          (paVar5->mName).data[__n] = '\0';
        }
        iVar1 = *(int *)((long)pLVar2 + lVar7 + -0x18);
        if (iVar1 == 3) {
          paVar5->mType = aiLightSource_DIRECTIONAL;
        }
        else if (iVar1 == 1) {
          paVar5->mType = aiLightSource_SPOT;
          fVar10 = *(float *)((long)pLVar2 + lVar7 + -4) * 0.017453292;
          paVar5->mAngleInnerCone = fVar10;
          fVar11 = *(float *)((long)&(pLVar2->super_BaseNode).mType + lVar7);
          uVar9 = -(uint)(fVar11 != 0.0);
          paVar5->mAngleOuterCone =
               (float)(~uVar9 & (uint)fVar10 | (uint)(fVar11 * 0.017453292) & uVar9);
        }
        else {
          paVar5->mType = aiLightSource_POINT;
        }
        fVar11 = *(float *)((long)pLVar2 + lVar7 + -8);
        fVar10 = *(float *)((long)pLVar2 + lVar7 + -0x14) * fVar11;
        fVar12 = *(float *)((long)pLVar2 + lVar7 + -0x10) * fVar11;
        fVar11 = fVar11 * *(float *)((long)pLVar2 + lVar7 + -0xc);
        (paVar5->mColorSpecular).r = fVar10;
        (paVar5->mColorSpecular).g = fVar12;
        (paVar5->mColorSpecular).b = fVar11;
        (paVar5->mColorDiffuse).r = fVar10;
        (paVar5->mColorDiffuse).g = fVar12;
        (paVar5->mColorDiffuse).b = fVar11;
        uVar6 = uVar6 + 1;
        paVar8 = this->pcScene;
        lVar7 = lVar7 + 0x170;
      } while (uVar6 < paVar8->mNumLights);
    }
  }
  return;
}

Assistant:

void ASEImporter::BuildLights()
{
    if (!mParser->m_vLights.empty())    {
        pcScene->mNumLights = (unsigned int)mParser->m_vLights.size();
        pcScene->mLights    = new aiLight*[pcScene->mNumLights];

        for (unsigned int i = 0; i < pcScene->mNumLights;++i)   {
            aiLight* out = pcScene->mLights[i] = new aiLight();
            ASE::Light& in = mParser->m_vLights[i];

            // The direction is encoded in the transformation matrix of the node.
            // In 3DS MAX the light source points into negative Z direction if
            // the node transformation is the identity.
            out->mDirection = aiVector3D(0.f,0.f,-1.f);

            out->mName.Set(in.mName);
            switch (in.mLightType)
            {
            case ASE::Light::TARGET:
                out->mType = aiLightSource_SPOT;
                out->mAngleInnerCone = AI_DEG_TO_RAD(in.mAngle);
                out->mAngleOuterCone = (in.mFalloff ? AI_DEG_TO_RAD(in.mFalloff) : out->mAngleInnerCone);
                break;

            case ASE::Light::DIRECTIONAL:
                out->mType = aiLightSource_DIRECTIONAL;
                break;

            default:
            //case ASE::Light::OMNI:
                out->mType = aiLightSource_POINT;
                break;
            };
            out->mColorDiffuse = out->mColorSpecular = in.mColor * in.mIntensity;
        }
    }
}